

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalMap.c
# Opt level: O3

void Gia_ManPrepareWin(Gia_Man_t *p,Vec_Int_t *vOuts,Vec_Int_t **pvPis,Vec_Int_t **pvPos,
                      Vec_Int_t **pvAnds,int fPoOnly)

{
  byte *pbVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Int_t **ppVVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  
  Gia_ManIncrementTravId(p);
  if (0 < vOuts->nSize) {
    lVar8 = 0;
    do {
      iVar2 = vOuts->pArray[lVar8];
      if (((long)iVar2 < 0) || (p->vCos->nSize <= iVar2)) goto LAB_0070c1fc;
      iVar2 = p->vCos->pArray[iVar2];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0070c21b;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ManHighlight_rec(p,iVar2 - (*(uint *)(p->pObjs + iVar2) & 0x1fffffff));
      lVar8 = lVar8 + 1;
    } while (lVar8 < vOuts->nSize);
  }
  Gia_ManCleanMark0(p);
  if (fPoOnly == 0) {
    if (1 < p->nObjs) {
      lVar8 = 1;
      lVar10 = 0xc;
      do {
        pGVar3 = p->pObjs;
        uVar4 = (uint)*(ulong *)(&pGVar3->field_0x0 + lVar10);
        if ((uVar4 & 0x9fffffff) != 0x9fffffff) {
          uVar9 = *(ulong *)(&pGVar3->field_0x0 + lVar10) & 0x1fffffff;
          if (uVar9 != 0x1fffffff && -1 < (int)uVar4) {
            if (p->nTravIdsAlloc <= lVar8) goto LAB_0070c23a;
            if (p->pTravIds[lVar8] != p->nTravIds) goto LAB_0070c0b2;
          }
          pbVar1 = (byte *)((long)pGVar3 + (ulong)(uint)((int)uVar9 << 2) * -3 + lVar10 + 3);
          *pbVar1 = *pbVar1 | 0x40;
          uVar4 = (uint)*(ulong *)(&pGVar3->field_0x0 + lVar10);
          if ((~uVar4 & 0x1fffffff) != 0 && -1 < (int)uVar4) {
            pbVar1 = (byte *)((long)pGVar3 +
                             lVar10 + (ulong)((uint)(*(ulong *)(&pGVar3->field_0x0 + lVar10) >> 0x1e
                                                    ) & 0x7ffffffc) * -3 + 3);
            *pbVar1 = *pbVar1 | 0x40;
          }
        }
LAB_0070c0b2:
        lVar8 = lVar8 + 1;
        lVar10 = lVar10 + 0xc;
      } while (lVar8 < p->nObjs);
    }
  }
  else if (0 < vOuts->nSize) {
    lVar8 = 0;
    do {
      iVar2 = vOuts->pArray[lVar8];
      if (((long)iVar2 < 0) || (p->vCos->nSize <= iVar2)) {
LAB_0070c1fc:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = p->vCos->pArray[iVar2];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_0070c21b:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar2;
      *(ulong *)(pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)) =
           *(ulong *)(pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)) | 0x40000000;
      lVar8 = lVar8 + 1;
    } while (lVar8 < vOuts->nSize);
  }
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(4000);
  pVVar5->pArray = piVar6;
  *pvPis = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(4000);
  pVVar5->pArray = piVar6;
  *pvPos = pVVar5;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(4000);
  pVVar5->pArray = piVar6;
  *pvAnds = pVVar5;
  if (1 < p->nObjs) {
    lVar10 = 1;
    lVar8 = 3;
    do {
      if (p->nTravIdsAlloc <= lVar10) {
LAB_0070c23a:
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
      }
      if (p->pTravIds[lVar10] == p->nTravIds) {
        pGVar3 = p->pObjs;
        uVar4 = (uint)*(undefined8 *)(&pGVar3->field_0x0 + lVar8 * 4);
        ppVVar7 = pvPis;
        if (((uVar4 & 0x9fffffff) == 0x9fffffff) || (ppVVar7 = pvPos, (uVar4 >> 0x1e & 1) != 0)) {
          Vec_IntPush(*ppVVar7,(int)lVar10);
        }
        uVar4 = *(uint *)(&pGVar3->field_0x0 + lVar8 * 4);
        if ((~uVar4 & 0x1fffffff) != 0 && -1 < (int)uVar4) {
          Vec_IntPush(*pvAnds,(int)lVar10);
        }
      }
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 3;
    } while (lVar10 < p->nObjs);
  }
  Gia_ManCleanMark0(p);
  return;
}

Assistant:

void Gia_ManPrepareWin( Gia_Man_t * p, Vec_Int_t * vOuts, Vec_Int_t ** pvPis, Vec_Int_t ** pvPos, Vec_Int_t ** pvAnds, int fPoOnly )
{
    Gia_Obj_t * pObj;
    int i;
    // mark the section
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCoVec( vOuts, p, pObj, i )
        Gia_ManHighlight_rec( p, Gia_ObjFaninId0p(p, pObj) );
    // mark fanins of the outside area
    Gia_ManCleanMark0( p );
    if ( fPoOnly )
    {
        Gia_ManForEachCoVec( vOuts, p, pObj, i )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
    }
    else
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( Gia_ObjIsCi(pObj) )
                continue;
            if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsTravIdCurrentId(p, i) )
                continue;
            Gia_ObjFanin0(pObj)->fMark0 = 1;
            if ( Gia_ObjIsAnd(pObj) )
                Gia_ObjFanin1(pObj)->fMark0 = 1;
        }
    }
    // collect pointed nodes
    *pvPis  = Vec_IntAlloc( 1000 );
    *pvPos  = Vec_IntAlloc( 1000 );
    *pvAnds = Vec_IntAlloc( 1000 );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( !Gia_ObjIsTravIdCurrentId(p, i) )
            continue;
        if ( Gia_ObjIsCi(pObj) )
            Vec_IntPush( *pvPis, i );
        else if ( pObj->fMark0 )
            Vec_IntPush( *pvPos, i );
        if ( Gia_ObjIsAnd(pObj) )
            Vec_IntPush( *pvAnds, i );
    }
    Gia_ManCleanMark0( p );
}